

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.h
# Opt level: O0

Connection
QObject::
connect<void(QPlatformMessageDialogHelper::*)(Qt::CheckState),QMessageBoxPrivate::initHelper(QPlatformDialogHelper*)::__0>
          (Object *sender,offset_in_QPlatformMessageDialogHelper_to_subr signal,ContextType *context
          ,anon_class_8_1_8991fb9c_for_o *slot,ConnectionType type)

{
  enable_if_t<QtPrivate::countMatchingArguments<void_(QPlatformMessageDialogHelper::*)(Qt::CheckState),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_dialogs_qmessagebox_cpp:2771:16)>()_>__0__QtPrivate__QSlotObjectBase__>
  pQVar1;
  void **in_RSI;
  QObject *in_RDI;
  void **in_R8;
  long in_FS_OFFSET;
  int in_stack_00000008;
  void **pSlot;
  int *types;
  int SlotArgumentCount;
  int FunctorArgumentCount;
  undefined4 in_stack_ffffffffffffff5c;
  anon_class_8_1_8991fb9c_for_o *in_stack_ffffffffffffff60;
  QMetaObject *local_58;
  QObject local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QMetaObject *)0x0;
  if ((in_stack_00000008 == 2) || (in_stack_00000008 == 3)) {
    local_58 = (QMetaObject *)
               QtPrivate::ConnectionTypes<QtPrivate::List<Qt::CheckState>,_true>::types();
  }
  pQVar1 = QtPrivate::
           makeCallableObject<void(QPlatformMessageDialogHelper::*)(Qt::CheckState),QMessageBoxPrivate::initHelper(QPlatformDialogHelper*)::__0>
                     (in_stack_ffffffffffffff60);
  QObject::connectImpl
            (in_RDI,in_RSI,local_18,in_R8,(QSlotObjectBase *)0x0,(ConnectionType)pQVar1,
             (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_00000008),local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Connection)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QMetaObject::Connection
        connect(const typename QtPrivate::FunctionPointer<Func1>::Object *sender, Func1 signal,
                const typename QtPrivate::ContextTypeForFunctor<Func2>::ContextType *context, Func2 &&slot,
                Qt::ConnectionType type = Qt::AutoConnection)
    {
        typedef QtPrivate::FunctionPointer<Func1> SignalType;
        typedef QtPrivate::FunctionPointer<std::decay_t<Func2>> SlotType;

        if constexpr (SlotType::ArgumentCount != -1) {
            static_assert((QtPrivate::AreArgumentsCompatible<typename SlotType::ReturnType, typename SignalType::ReturnType>::value),
                            "Return type of the slot is not compatible with the return type of the signal.");
        } else {
            constexpr int FunctorArgumentCount = QtPrivate::ComputeFunctorArgumentCount<std::decay_t<Func2>, typename SignalType::Arguments>::Value;
            [[maybe_unused]]
            constexpr int SlotArgumentCount = (FunctorArgumentCount >= 0) ? FunctorArgumentCount : 0;
            typedef typename QtPrivate::FunctorReturnType<std::decay_t<Func2>, typename QtPrivate::List_Left<typename SignalType::Arguments, SlotArgumentCount>::Value>::type SlotReturnType;

            static_assert((QtPrivate::AreArgumentsCompatible<SlotReturnType, typename SignalType::ReturnType>::value),
                            "Return type of the slot is not compatible with the return type of the signal.");
        }

        static_assert(QtPrivate::HasQ_OBJECT_Macro<typename SignalType::Object>::Value,
                          "No Q_OBJECT in the class with the signal");

        //compilation error if the arguments does not match.
        static_assert(int(SignalType::ArgumentCount) >= int(SlotType::ArgumentCount),
                          "The slot requires more arguments than the signal provides.");

        const int *types = nullptr;
        if (type == Qt::QueuedConnection || type == Qt::BlockingQueuedConnection)
            types = QtPrivate::ConnectionTypes<typename SignalType::Arguments>::types();

        void **pSlot = nullptr;
        if constexpr (std::is_member_function_pointer_v<std::decay_t<Func2>>) {
            pSlot = const_cast<void **>(reinterpret_cast<void *const *>(&slot));
        } else {
            Q_ASSERT_X((type & Qt::UniqueConnection) == 0, "",
                       "QObject::connect: Unique connection requires the slot to be a pointer to "
                       "a member function of a QObject subclass.");
        }

        return connectImpl(sender, reinterpret_cast<void **>(&signal), context, pSlot,
                           QtPrivate::makeCallableObject<Func1>(std::forward<Func2>(slot)),
                           type, types, &SignalType::Object::staticMetaObject);
    }